

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

uint64_t lj_carith_shift64(uint64_t x,int32_t sh,int op)

{
  byte bVar1;
  int op_local;
  int32_t sh_local;
  uint64_t x_local;
  
  bVar1 = (byte)sh;
  x_local = x;
  switch(op) {
  case 0:
    x_local = x << (bVar1 & 0x3f);
    break;
  case 1:
    x_local = x >> (bVar1 & 0x3f);
    break;
  case 2:
    x_local = (long)x >> (bVar1 & 0x3f);
    break;
  case 3:
    x_local = x << (bVar1 & 0x3f) | x >> (-(bVar1 & 0x3f) & 0x3f);
    break;
  case 4:
    x_local = x << (-(bVar1 & 0x3f) & 0x3f) | x >> (bVar1 & 0x3f);
  }
  return x_local;
}

Assistant:

uint64_t lj_carith_shift64(uint64_t x, int32_t sh, int op)
{
  switch (op) {
  case IR_BSHL-IR_BSHL: x = lj_carith_shl64(x, sh); break;
  case IR_BSHR-IR_BSHL: x = lj_carith_shr64(x, sh); break;
  case IR_BSAR-IR_BSHL: x = lj_carith_sar64(x, sh); break;
  case IR_BROL-IR_BSHL: x = lj_carith_rol64(x, sh); break;
  case IR_BROR-IR_BSHL: x = lj_carith_ror64(x, sh); break;
  default:
    lj_assertX(0, "bad shift op %d", op);
    break;
  }
  return x;
}